

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

EPSG * EPSG_new(UINT32 c,UINT32 r)

{
  uint32_t local_28;
  byte local_21;
  uint8_t i;
  EPSG *psg;
  UINT32 r_local;
  UINT32 c_local;
  
  _r_local = (EPSG *)calloc(1,0xc0);
  if (_r_local == (EPSG *)0x0) {
    _r_local = (EPSG *)0x0;
  }
  else {
    EPSG_setVolumeMode(_r_local,1);
    _r_local->clk = c;
    local_28 = r;
    if (r == 0) {
      local_28 = 0xac44;
    }
    _r_local->rate = local_28;
    _r_local->chp_flags = '\0';
    EPSG_set_quality(_r_local,0);
    for (local_21 = 0; local_21 < 3; local_21 = local_21 + 1) {
      _r_local->stereo_mask[local_21] = '\x03';
      Panning_Centre(_r_local->pan[local_21]);
    }
    _r_local->pcm3ch = '\0';
    _r_local->pcm3ch_detect = '\0';
    EPSG_setMask(_r_local,0);
  }
  return _r_local;
}

Assistant:

EPSG *
EPSG_new (UINT32 c, UINT32 r)
{
  EPSG *psg;
  uint8_t i;

  psg = (EPSG *) calloc (1, sizeof (EPSG));
  if (psg == NULL)
    return NULL;

  EPSG_setVolumeMode (psg, EMU2149_VOL_DEFAULT);
  psg->clk = c;
  psg->rate = r ? r : 44100;
  psg->chp_flags = 0x00;
  EPSG_set_quality (psg, 0);

  for (i = 0; i < 3; i++)
  {
    psg->stereo_mask[i] = 0x03;
    Panning_Centre(psg->pan[i]);
  }
  psg->pcm3ch = 0;
  psg->pcm3ch_detect = 0;

  EPSG_setMask(psg, 0x00);

  return psg;
}